

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O1

int pulse_stream_get_latency(cubeb_stream_conflict *stm,uint32_t *latency)

{
  int iVar1;
  int iVar2;
  pa_usec_t r_usec;
  int negative;
  pa_usec_t local_30;
  int local_24;
  
  iVar2 = -1;
  if ((stm != (cubeb_stream_conflict *)0x0) && (stm->output_stream != (pa_stream *)0x0)) {
    iVar1 = (*cubeb_pa_stream_get_latency)(stm->output_stream,&local_30,&local_24);
    if (local_24 != 0) {
      __assert_fail("!negative",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                    ,0x494,"int pulse_stream_get_latency(cubeb_stream *, uint32_t *)");
    }
    if (iVar1 == 0) {
      *latency = (uint32_t)(((stm->output_sample_spec).rate * local_30) / 1000000);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
pulse_stream_get_latency(cubeb_stream * stm, uint32_t * latency)
{
  pa_usec_t r_usec;
  int negative, r;

  if (!stm || !stm->output_stream) {
    return CUBEB_ERROR;
  }

  r = WRAP(pa_stream_get_latency)(stm->output_stream, &r_usec, &negative);
  assert(!negative);
  if (r) {
    return CUBEB_ERROR;
  }

  *latency = r_usec * stm->output_sample_spec.rate / PA_USEC_PER_SEC;
  return CUBEB_OK;
}